

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpproxy.cpp
# Opt level: O0

void __thiscall httpproxy::~httpproxy(httpproxy *this)

{
  httpproxy *this_local;
  
  ~httpproxy(this);
  operator_delete(this);
  return;
}

Assistant:

httpproxy::~httpproxy()
{
    clientfds.clear();
    if (events)
    {
        delete[] events;
        events = NULL;
    }
    if (cfg)
    {
        delete[] cfg;
        cfg = NULL;
    }
}